

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_StartStream(PaStream *stream)

{
  PaStream *in_RDI;
  PaError result;
  undefined4 local_c;
  
  local_c = PaUtil_ValidateStreamPointer(in_RDI);
  if (local_c == 0) {
    local_c = (**(code **)(*(long *)((long)in_RDI + 0x10) + 0x20))(in_RDI);
    if (local_c == 0) {
      local_c = -0x26fe;
    }
    else if (local_c == 1) {
      local_c = (**(code **)(*(long *)((long)in_RDI + 0x10) + 8))(in_RDI);
    }
  }
  return local_c;
}

Assistant:

PaError Pa_StartStream( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_StartStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = paStreamIsNotStopped ;
        }
        else if( result == 1 )
        {
            result = PA_STREAM_INTERFACE(stream)->Start( stream );
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_StartStream", result );

    return result;
}